

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operators.h
# Opt level: O1

string * __thiscall
calc4::BinaryOperator::ToString_abi_cxx11_(string *__return_storage_ptr__,BinaryOperator *this)

{
  char *__s;
  size_t sVar1;
  ostringstream oss;
  undefined1 auStack_198 [8];
  long local_190 [14];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"BinaryOperator [Type = ",0x17);
  __s = ToString::BinaryTypeTable[(int)this->type];
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"]",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string ToString() const override
    {
        static const char* BinaryTypeTable[] = { "Add",
                                                 "Sub",
                                                 "Mult",
                                                 "Div",
                                                 "Mod",
                                                 "Equal",
                                                 "NotEqual",
                                                 "LessThan",
                                                 "LessThanOrEqual",
                                                 "GreaterThanOrEqual",
                                                 "GreaterThan" };
        std::ostringstream oss;
        oss << "BinaryOperator [Type = " << BinaryTypeTable[(size_t)type] << "]";
        return oss.str();
    }